

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::ZConsVisitor::readZconsFile(ZConsVisitor *this,RealType time)

{
  bool bVar1;
  ZConsReader *this_00;
  
  this_00 = this->zconsReader_;
  while( true ) {
    bVar1 = ZConsReader::hasNextFrame(this_00);
    if ((!bVar1) || (time <= this->zconsReader_->curTime_)) break;
    ZConsReader::readNextFrame(this->zconsReader_);
    this_00 = this->zconsReader_;
  }
  return;
}

Assistant:

void ZConsVisitor::readZconsFile(RealType time) {
    RealType tempTime;
    while (zconsReader_->hasNextFrame()) {
      tempTime = zconsReader_->getCurTime();
      if (tempTime >= time) { return; }

      zconsReader_->readNextFrame();
    }
  }